

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setPositiveSuffix(DecimalFormat *this,UnicodeString *newValue)

{
  UBool UVar1;
  
  UVar1 = UnicodeString::operator==
                    (newValue,&((this->fields->properties).
                                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>
                               .ptr)->positiveSuffix);
  if (UVar1 != '\0') {
    return;
  }
  UnicodeString::operator=
            (&((this->fields->properties).
               super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
              positiveSuffix,newValue);
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setPositiveSuffix(const UnicodeString& newValue) {
    if (newValue == fields->properties->positiveSuffix) { return; }
    fields->properties->positiveSuffix = newValue;
    touchNoError();
}